

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O1

bool __thiscall QMdiArea::event(QMdiArea *this,QEvent *event)

{
  ushort uVar1;
  QMdiAreaPrivate *this_00;
  QPointer<QMdiSubWindow> *pQVar2;
  long lVar3;
  Data *pDVar4;
  bool bVar5;
  QObject *pQVar6;
  long lVar7;
  long lVar8;
  long in_FS_OFFSET;
  QArrayDataPointer<QPointer<QMdiSubWindow>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMdiAreaPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  uVar1 = *(ushort *)(event + 8);
  if (0x21 < uVar1) {
    if (uVar1 == 0x22) {
      local_58.d = (this_00->childWindows).d.d;
      pQVar2 = (this_00->childWindows).d.ptr;
      local_58.size = (this_00->childWindows).d.size;
      if (local_58.d != (Data *)0x0) {
        LOCK();
        ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_58.ptr = pQVar2;
      if (local_58.size != 0) {
        lVar7 = local_58.size << 4;
        lVar8 = 0;
        do {
          lVar3 = *(long *)((long)&(pQVar2->wp).d + lVar8);
          if ((lVar3 == 0) || (*(int *)(lVar3 + 4) == 0)) {
            pQVar6 = (QObject *)0x0;
          }
          else {
            pQVar6 = *(QObject **)((long)&(pQVar2->wp).value + lVar8);
          }
          bVar5 = sanityCheck((QMdiSubWindow *)pQVar6,"QMdiArea::WindowIconChange");
          if (bVar5) {
            QCoreApplication::sendEvent(pQVar6,event);
          }
          lVar8 = lVar8 + 0x10;
        } while (lVar7 != lVar8);
      }
      QArrayDataPointer<QPointer<QMdiSubWindow>_>::~QArrayDataPointer(&local_58);
    }
    else if (uVar1 == 0x5a) {
      QMdiAreaPrivate::updateTabBarGeometry(this_00);
    }
    else if ((uVar1 == 100) && (this_00->isSubWindowsTiled == true)) {
      tileSubWindows(this);
      this_00->isSubWindowsTiled = true;
    }
    goto LAB_0044b8b9;
  }
  if (uVar1 == 0x12) {
    pDVar4 = (this_00->active).wp.d;
    if ((pDVar4 == (Data *)0x0) || (*(int *)(pDVar4 + 4) == 0)) {
      pQVar6 = (QObject *)0x0;
    }
    else {
      pQVar6 = (this_00->active).wp.value;
    }
    if (pQVar6 != (QObject *)0x0) {
      QMdiSubWindowPrivate::setActive(*(QMdiSubWindowPrivate **)(pQVar6 + 8),false,false);
    }
    bVar5 = false;
  }
  else {
    if (uVar1 == 0x18) {
      this_00->isActivated = true;
      if ((this_00->childWindows).d.size == 0) goto LAB_0044b8b9;
      pDVar4 = (this_00->active).wp.d;
      if (((pDVar4 == (Data *)0x0) || (*(int *)(pDVar4 + 4) == 0)) ||
         ((this_00->active).wp.value == (QObject *)0x0)) {
        QMdiAreaPrivate::activateCurrentWindow(this_00);
      }
    }
    else {
      if (uVar1 != 0x19) goto LAB_0044b8b9;
      this_00->isActivated = false;
    }
    bVar5 = true;
  }
  QMdiAreaPrivate::setChildActivationEnabled(this_00,false,bVar5);
LAB_0044b8b9:
  bVar5 = QAbstractScrollArea::event((QAbstractScrollArea *)this,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QMdiArea::event(QEvent *event)
{
    Q_D(QMdiArea);
    switch (event->type()) {
    case QEvent::WindowActivate: {
        d->isActivated = true;
        if (d->childWindows.isEmpty())
            break;
        if (!d->active)
            d->activateCurrentWindow();
        d->setChildActivationEnabled(false, true);
        break;
    }
    case QEvent::WindowDeactivate:
        d->isActivated = false;
        d->setChildActivationEnabled(false, true);
        break;
    case QEvent::StyleChange:
        // Re-tile the views if we're in tiled mode. Re-tile means we will change
        // the geometry of the children, which in turn means 'isSubWindowsTiled'
        // is set to false, so we have to update the state at the end.
        if (d->isSubWindowsTiled) {
            tileSubWindows();
            d->isSubWindowsTiled = true;
        }
        break;
    case QEvent::WindowIconChange: {
        // Take a copy because QCoreApplication::sendEvent() may call unknown code,
        // that may cause recursing into the class
        const auto subWindows = d->childWindows;
        for (QMdiSubWindow *window : subWindows) {
            if (sanityCheck(window, "QMdiArea::WindowIconChange"))
                QCoreApplication::sendEvent(window, event);
        }
        break;
    }
    case QEvent::Hide:
        d->setActive(d->active, false, false);
        d->setChildActivationEnabled(false);
        break;
#if QT_CONFIG(tabbar)
    case QEvent::LayoutDirectionChange:
        d->updateTabBarGeometry();
        break;
#endif
    default:
        break;
    }
    return QAbstractScrollArea::event(event);
}